

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void add_stream(c2m_ctx_t c2m_ctx,FILE *f,char *fname,_func_int_c2m_ctx_t *getc_func)

{
  FILE *__stream;
  VARR_stream_t *pVVar1;
  stream_t psVar2;
  ulong uVar3;
  stream_t *ppsVar4;
  size_t sVar5;
  
  if (fname == (char *)0x0) {
    __assert_fail("fname != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x3ad,"void add_stream(c2m_ctx_t, FILE *, const char *, int (*)(c2m_ctx_t))");
  }
  psVar2 = c2m_ctx->cs;
  if (((psVar2 != (stream_t)0x0) && (__stream = (FILE *)psVar2->f, __stream != (FILE *)0x0)) &&
     (__stream != _stdin)) {
    fgetpos(__stream,(fpos_t *)&psVar2->fpos);
    fclose((FILE *)c2m_ctx->cs->f);
    c2m_ctx->cs->f = (FILE *)0x0;
  }
  psVar2 = new_stream(f,fname,getc_func);
  c2m_ctx->cs = psVar2;
  pVVar1 = c2m_ctx->streams;
  ppsVar4 = pVVar1->varr;
  if (ppsVar4 != (stream_t *)0x0) {
    uVar3 = pVVar1->els_num + 1;
    if (pVVar1->size < uVar3) {
      sVar5 = (uVar3 >> 1) + uVar3;
      ppsVar4 = (stream_t *)realloc(ppsVar4,sVar5 * 8);
      pVVar1->varr = ppsVar4;
      pVVar1->size = sVar5;
    }
    sVar5 = pVVar1->els_num;
    pVVar1->els_num = sVar5 + 1;
    pVVar1->varr[sVar5] = psVar2;
    return;
  }
  add_stream_cold_1();
  (*(code *)ppsVar4[0x29])(ppsVar4[0x2a]);
  return;
}

Assistant:

static void add_stream (c2m_ctx_t c2m_ctx, FILE *f, const char *fname,
                        int (*getc_func) (c2m_ctx_t)) {
  assert (fname != NULL);
  if (cs != NULL && cs->f != NULL && cs->f != stdin) {
    fgetpos (cs->f, &cs->fpos);
    fclose (cs->f);
    cs->f = NULL;
  }
  cs = new_stream (f, fname, getc_func);
  VARR_PUSH (stream_t, streams, cs);
}